

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O1

void plutovg_blend(plutovg_canvas_t *canvas,plutovg_span_buffer_t *span_buffer)

{
  float *pfVar1;
  plutovg_state_t *ppVar2;
  plutovg_paint_t pVar3;
  composition_function_t p_Var4;
  plutovg_surface_t *ppVar5;
  bool bVar6;
  _Bool _Var7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  plutovg_span_t *ppVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  plutovg_paint_t *ppVar21;
  uint uVar22;
  plutovg_color_t *color;
  uint uVar23;
  uint32_t *puVar24;
  uint uVar25;
  ulong uVar26;
  undefined4 uVar27;
  int iVar28;
  ulong uVar29;
  undefined4 *puVar30;
  int iVar31;
  int xoff;
  int iVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  composition_function_t func;
  int image_width;
  int image_height;
  uint buffer [1024];
  uint32_t buffer_1 [1024];
  plutovg_span_t *local_2138;
  float local_2108;
  float local_20f8;
  undefined1 local_2068 [12];
  float fStack_205c;
  plutovg_paint_t local_2058;
  long local_2050;
  uint local_2048;
  uint local_2044;
  int local_2040;
  int local_203c;
  float fStack_106c;
  undefined1 local_1068 [12];
  float fStack_105c;
  plutovg_paint_t local_1058;
  plutovg_paint_type_t local_1050;
  float local_104c [1024];
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  
  if ((span_buffer->spans).size != 0) {
    ppVar2 = canvas->state;
    ppVar21 = ppVar2->paint;
    if (ppVar21 == (plutovg_paint_t *)0x0) {
      color = &ppVar2->color;
LAB_001258ac:
      plutovg_blend_color(canvas,color,span_buffer);
      return;
    }
    if (ppVar21->type == PLUTOVG_PAINT_TYPE_GRADIENT) {
      if (ppVar21[6].ref_count != 0) {
        local_1050 = ppVar21[1].type;
        local_1068._0_8_ = ppVar21[2];
        unique0x10000d8a = ppVar21[3];
        local_1058 = ppVar21[4];
        plutovg_matrix_multiply
                  ((plutovg_matrix_t *)local_1068,(plutovg_matrix_t *)local_1068,&ppVar2->matrix);
        _Var7 = plutovg_matrix_invert((plutovg_matrix_t *)local_1068,(plutovg_matrix_t *)local_1068)
        ;
        if (_Var7) {
          iVar32 = ppVar21[6].ref_count;
          lVar13 = (long)iVar32;
          fVar33 = ppVar2->opacity;
          pVar3 = ppVar21[5];
          uVar26 = lroundf(*(float *)((long)pVar3 + 0x10) * fVar33 * 255.0);
          fVar37 = (float)(uVar26 & 0xffffffff);
          lVar9 = lroundf(*(float *)((long)pVar3 + 4) * fVar37);
          lVar10 = lroundf(*(float *)((long)pVar3 + 8) * fVar37);
          lVar11 = lroundf(fVar37 * *(float *)((long)pVar3 + 0xc));
          fVar34 = (float)((int)lVar10 << 8 | (uint)lVar11 |
                          (int)lVar9 << 0x10 | (int)uVar26 << 0x18);
          local_104c[0] = fVar34;
          fVar37 = *(float *)pVar3;
          fVar38 = 0.0014648438;
          uVar26 = 1;
          if (0.0014648438 <= fVar37) {
            fVar38 = 0.0014648438;
            lVar9 = 8;
            do {
              *(float *)((long)&((plutovg_paint_t *)local_1068)->ref_count + lVar9 * 4) =
                   (&fStack_106c)[lVar9];
              fVar38 = fVar38 + 0.0009765625;
              lVar9 = lVar9 + 1;
            } while (fVar38 <= fVar37);
            uVar26 = (ulong)((int)lVar9 - 7);
          }
          iVar8 = (int)uVar26;
          if (1 < iVar32) {
            uVar29 = 0;
            do {
              fVar37 = *(float *)((long)pVar3 + uVar29 * 0x14);
              fVar39 = *(float *)((long)pVar3 + (uVar29 * 5 + 5) * 4);
              if ((fVar37 != fVar39) || (fVar35 = fVar34, NAN(fVar37) || NAN(fVar39))) {
                pfVar1 = (float *)((long)pVar3 + uVar29 * 0x14);
                uVar12 = lroundf(pfVar1[9] * fVar33 * 255.0);
                fVar35 = (float)(uVar12 & 0xffffffff);
                lVar9 = lroundf(pfVar1[6] * fVar35);
                lVar10 = lroundf(pfVar1[7] * fVar35);
                lVar11 = lroundf(fVar35 * pfVar1[8]);
                fVar35 = (float)((int)lVar10 << 8 | (uint)lVar11 |
                                (int)lVar9 << 0x10 | (int)uVar12 << 0x18);
                fVar40 = pfVar1[5];
                if ((fVar38 < fVar40) && ((int)uVar26 < 0x400)) {
                  fVar43 = *pfVar1;
                  uVar12 = (long)(int)uVar26;
                  do {
                    iVar8 = (int)(long)((fVar38 - fVar43) * (1.0 / (fVar39 - fVar37)) * 255.0);
                    uVar25 = ((uint)fVar35 & 0xff00ff) * iVar8 +
                             (0xff - iVar8) * ((uint)fVar34 & 0xff00ff);
                    uVar23 = iVar8 * ((uint)fVar35 >> 8 & 0xff00ff) +
                             (0xff - iVar8) * ((uint)fVar34 >> 8 & 0xff00ff);
                    local_104c[uVar12] =
                         (float)(uVar23 + 0x800080 + (uVar23 >> 8 & 0xff00ff) & 0xff00ff00 |
                                uVar25 + 0x800080 + (uVar25 >> 8 & 0xff00ff) >> 8 & 0xff00ff);
                    uVar26 = uVar12 + 1;
                    fVar38 = fVar38 + 0.0009765625;
                    if (0x3fe < (long)uVar12) break;
                    uVar12 = uVar26;
                  } while (fVar38 < fVar40);
                }
              }
              fVar34 = fVar35;
              iVar8 = (int)uVar26;
              uVar29 = uVar29 + 1;
            } while (uVar29 != iVar32 - 1);
          }
          uVar26 = lroundf(fVar33 * *(float *)((long)pVar3 + (lVar13 * 5 + -1) * 4) * 255.0);
          fVar33 = (float)(uVar26 & 0xffffffff);
          lVar9 = lroundf(*(float *)((long)pVar3 + (lVar13 * 5 + -4) * 4) * fVar33);
          lVar10 = lroundf(*(float *)((long)pVar3 + (lVar13 * 5 + -3) * 4) * fVar33);
          lVar13 = lroundf(fVar33 * *(float *)((long)pVar3 + (lVar13 * 5 + -2) * 4));
          if (iVar8 < 0x400) {
            lVar11 = (long)iVar8;
            do {
              local_104c[lVar11] =
                   (float)((int)lVar10 << 8 | (uint)lVar13 |
                          (int)lVar9 << 0x10 | (int)uVar26 << 0x18);
              lVar11 = lVar11 + 1;
            } while ((int)lVar11 != 0x400);
          }
          local_4c = (float)ppVar21[6].type;
          local_48 = (float)ppVar21[7].ref_count;
          local_44 = (float)ppVar21[7].type;
          local_40 = (float)ppVar21[8].ref_count;
          if (ppVar21[1].ref_count == 0) {
            local_2108 = local_44 - local_4c;
            fVar33 = local_40 - local_48;
            fVar37 = local_2108 * local_2108 + fVar33 * fVar33;
            if ((fVar37 != 0.0) || (NAN(fVar37))) {
              local_2108 = local_2108 / fVar37;
              fVar33 = fVar33 / fVar37;
              local_20f8 = -local_2108 * local_4c - local_48 * fVar33;
            }
            else {
              local_20f8 = 0.0;
            }
            iVar32 = (span_buffer->spans).size;
            if (iVar32 != 0) {
              ppVar5 = canvas->surface;
              p_Var4 = composition_table[ppVar2->op];
              ppVar14 = (span_buffer->spans).data;
              do {
                iVar8 = ppVar14->len;
                if (iVar8 != 0) {
                  iVar17 = ppVar14->x;
                  do {
                    iVar31 = 0x400;
                    if (iVar8 < 0x400) {
                      iVar31 = iVar8;
                    }
                    fVar34 = 0.0;
                    fVar38 = 0.0;
                    if ((fVar37 != 0.0) || (NAN(fVar37))) {
                      fVar34 = (float)ppVar14->y + 0.5;
                      fVar38 = (((float)local_1068._8_4_ * fVar34 +
                                 ((float)iVar17 + 0.5) * (float)local_1068._0_4_ +
                                (float)local_1058.ref_count) * local_2108 +
                                (fVar34 * fStack_105c +
                                 ((float)iVar17 + 0.5) * (float)local_1068._4_4_ +
                                (float)local_1058.type) * fVar33 + local_20f8) * 1023.0;
                      fVar34 = ((float)local_1068._0_4_ * local_2108 +
                               (float)local_1068._4_4_ * fVar33) * 1023.0;
                    }
                    uVar23 = 0x3ff;
                    if (1e-05 <= ABS(fVar34)) {
                      puVar30 = (undefined4 *)
                                ((long)&((plutovg_paint_t *)local_2068)->ref_count +
                                (long)iVar31 * 4);
                      fVar39 = (float)iVar31 * fVar34 + fVar38;
                      if ((4194303.0 <= fVar39) || (fVar39 <= -4194304.0)) {
                        if (0 < iVar8) {
                          ppVar21 = (plutovg_paint_t *)local_2068;
                          do {
                            uVar25 = (uint)(fVar38 * 0.0009765625 * 1023.0 + 0.5);
                            if (local_1050 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                              uVar25 = uVar25 & 0x7ff;
                              if (0x3ff < uVar25) {
                                uVar25 = uVar25 ^ 0x7ff;
                              }
                            }
                            else if (local_1050 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                              uVar25 = uVar25 & 0x3ff;
                            }
                            else if ((int)uVar25 < 0) {
                              uVar25 = 0;
                            }
                            else if (0x3fe < (int)uVar25) {
                              uVar25 = uVar23;
                            }
                            ppVar21->ref_count = (int)local_104c[(int)uVar25];
                            fVar38 = fVar38 + fVar34;
                            ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                          } while (ppVar21 < puVar30);
                        }
                      }
                      else if (0 < iVar8) {
                        iVar18 = (int)(fVar38 * 256.0) + 0x80;
                        ppVar21 = (plutovg_paint_t *)local_2068;
                        do {
                          uVar25 = iVar18 >> 8;
                          if (local_1050 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                            uVar25 = uVar25 & 0x7ff;
                            if (0x3ff < uVar25) {
                              uVar25 = uVar25 ^ 0x7ff;
                            }
                          }
                          else if (local_1050 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                            uVar25 = uVar25 & 0x3ff;
                          }
                          else if ((int)uVar25 < 0) {
                            uVar25 = 0;
                          }
                          else if (0x3fe < (int)uVar25) {
                            uVar25 = uVar23;
                          }
                          ppVar21->ref_count = (int)local_104c[(int)uVar25];
                          ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                          iVar18 = iVar18 + (int)(fVar34 * 256.0);
                        } while (ppVar21 < puVar30);
                      }
                    }
                    else {
                      uVar25 = (int)(fVar38 * 256.0) + 0x80 >> 8;
                      if (local_1050 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                        uVar25 = uVar25 & 0x7ff;
                        if (0x3ff < uVar25) {
                          uVar25 = uVar25 ^ 0x7ff;
                        }
                      }
                      else if (local_1050 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                        uVar25 = uVar25 & 0x3ff;
                      }
                      else if ((int)uVar25 < 0) {
                        uVar25 = 0;
                      }
                      else if (0x3fe < (int)uVar25) {
                        uVar25 = uVar23;
                      }
                      plutovg_memfill32((uint *)local_2068,iVar31,(uint)local_104c[(int)uVar25]);
                    }
                    (*p_Var4)((uint32_t *)
                              (ppVar5->data +
                              (long)iVar17 * 4 + (long)ppVar5->stride * (long)ppVar14->y),iVar31,
                              (uint32_t *)local_2068,(uint32_t)ppVar14->coverage);
                    iVar17 = iVar17 + iVar31;
                    iVar8 = iVar8 - iVar31;
                  } while (iVar8 != 0);
                }
                iVar32 = iVar32 + -1;
                ppVar14 = ppVar14 + 1;
              } while (iVar32 != 0);
            }
          }
          else {
            local_3c = (float)ppVar21[8].type;
            local_38 = (float)ppVar21[9].ref_count;
            iVar32 = (span_buffer->spans).size;
            if (iVar32 != 0) {
              ppVar5 = canvas->surface;
              p_Var4 = composition_table[ppVar2->op];
              fVar40 = local_4c - local_40;
              fVar43 = local_48 - local_3c;
              fVar39 = local_44 - local_38;
              fVar37 = local_38 * local_38;
              fVar35 = (fVar39 * fVar39 - fVar40 * fVar40) - fVar43 * fVar43;
              bVar6 = local_38 == 0.0;
              ppVar14 = (span_buffer->spans).data;
              fVar34 = 1.0 / (fVar35 + fVar35);
              fVar38 = fVar34 * fVar34;
              fVar33 = fVar35 * 4.0;
              do {
                iVar8 = ppVar14->len;
                if (iVar8 != 0) {
                  iVar17 = ppVar14->x;
                  do {
                    iVar31 = 0x400;
                    if (iVar8 < 0x400) {
                      iVar31 = iVar8;
                    }
                    if ((fVar35 != 0.0) || (NAN(fVar35))) {
                      fVar41 = (float)ppVar14->y + 0.5;
                      fVar36 = ((float)local_1068._0_4_ * ((float)iVar17 + 0.5) +
                               (float)local_1068._8_4_ * fVar41 + (float)local_1058.ref_count) -
                               local_40;
                      fVar46 = (((float)iVar17 + 0.5) * (float)local_1068._4_4_ +
                               fVar41 * fStack_105c + (float)local_1058.type) - local_3c;
                      fVar44 = fVar46 * fVar43 + local_38 * fVar39 + fVar40 * fVar36;
                      fVar44 = fVar44 + fVar44;
                      fVar42 = (float)local_1068._0_4_ * fVar40 + fVar43 * (float)local_1068._4_4_;
                      fVar42 = fVar42 + fVar42;
                      fVar41 = (float)local_1068._0_4_ * (float)local_1068._0_4_ +
                               (float)local_1068._4_4_ * (float)local_1068._4_4_;
                      fVar47 = fVar46 * (float)local_1068._4_4_ + fVar36 * (float)local_1068._0_4_;
                      fVar45 = fVar34 * fVar44;
                      fVar36 = ((fVar37 - (fVar36 * fVar36 + fVar46 * fVar46)) * -fVar33 +
                               fVar44 * fVar44) * fVar38;
                      fVar44 = ((fVar47 + fVar47 + fVar41) * fVar33 +
                               fVar42 * fVar42 + (fVar44 + fVar44) * fVar42) * fVar38;
                      fVar41 = ((fVar41 + fVar41) * fVar33 + (fVar42 + fVar42) * fVar42) * fVar38;
                      puVar30 = (undefined4 *)
                                ((long)&((plutovg_paint_t *)local_2068)->ref_count +
                                (long)iVar31 * 4);
                      if (0.0 < fVar35 && bVar6) {
                        if (0 < iVar8) {
                          ppVar21 = (plutovg_paint_t *)local_2068;
                          do {
                            if (fVar36 < 0.0) {
                              fVar46 = sqrtf(fVar36);
                            }
                            else {
                              fVar46 = SQRT(fVar36);
                            }
                            uVar23 = (uint)((fVar46 - fVar45) * 1023.0 + 0.5);
                            if (local_1050 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                              uVar23 = uVar23 & 0x7ff;
                              if (0x3ff < uVar23) {
                                uVar23 = uVar23 ^ 0x7ff;
                              }
                            }
                            else if (local_1050 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                              uVar23 = uVar23 & 0x3ff;
                            }
                            else if ((int)uVar23 < 0) {
                              uVar23 = 0;
                            }
                            else if (0x3fe < (int)uVar23) {
                              uVar23 = 0x3ff;
                            }
                            ppVar21->ref_count = (int)local_104c[(int)uVar23];
                            ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                            fVar36 = fVar36 + fVar44;
                            fVar44 = fVar44 + fVar41;
                            fVar45 = fVar45 + fVar34 * fVar42;
                          } while (ppVar21 < puVar30);
                        }
                      }
                      else if (0 < iVar8) {
                        ppVar21 = (plutovg_paint_t *)local_2068;
                        do {
                          fVar46 = 0.0;
                          if (fVar36 >= 0.0) {
                            if (fVar36 < 0.0) {
                              fVar47 = sqrtf(fVar36);
                            }
                            else {
                              fVar47 = SQRT(fVar36);
                            }
                            fVar46 = 0.0;
                            if (0.0 <= fVar39 * (fVar47 - fVar45) + local_38) {
                              uVar23 = (uint)((fVar47 - fVar45) * 1023.0 + 0.5);
                              if (local_1050 == PLUTOVG_PAINT_TYPE_GRADIENT) {
                                uVar23 = uVar23 & 0x7ff;
                                if (0x3ff < uVar23) {
                                  uVar23 = uVar23 ^ 0x7ff;
                                }
                              }
                              else if (local_1050 == PLUTOVG_PAINT_TYPE_TEXTURE) {
                                uVar23 = uVar23 & 0x3ff;
                              }
                              else if ((int)uVar23 < 0) {
                                uVar23 = 0;
                              }
                              else if (0x3fe < (int)uVar23) {
                                uVar23 = 0x3ff;
                              }
                              fVar46 = local_104c[(int)uVar23];
                            }
                          }
                          ppVar21->ref_count = (int)fVar46;
                          fVar36 = fVar36 + fVar44;
                          fVar44 = fVar44 + fVar41;
                          fVar45 = fVar45 + fVar34 * fVar42;
                          ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                        } while (ppVar21 < puVar30);
                      }
                    }
                    else {
                      plutovg_memfill32((uint *)local_2068,iVar31,0);
                    }
                    (*p_Var4)((uint32_t *)
                              (ppVar5->data +
                              (long)iVar17 * 4 + (long)ppVar5->stride * (long)ppVar14->y),iVar31,
                              (uint32_t *)local_2068,(uint32_t)ppVar14->coverage);
                    iVar17 = iVar17 + iVar31;
                    iVar8 = iVar8 - iVar31;
                  } while (iVar8 != 0);
                }
                iVar32 = iVar32 + -1;
                ppVar14 = ppVar14 + 1;
              } while (iVar32 != 0);
            }
          }
        }
      }
    }
    else {
      if (ppVar21->type == PLUTOVG_PAINT_TYPE_COLOR) {
        color = (plutovg_color_t *)(ppVar21 + 1);
        goto LAB_001258ac;
      }
      pVar3 = ppVar21[5];
      if (pVar3 != (plutovg_paint_t)0x0) {
        local_2058 = ppVar21[4];
        local_2068._0_8_ = ppVar21[2];
        unique0x10000daa = ppVar21[3];
        local_2050 = *(long *)((long)pVar3 + 0x10);
        local_2048 = *(uint *)((long)pVar3 + 4);
        local_2044 = *(uint *)((long)pVar3 + 8);
        local_2040 = *(int *)((long)pVar3 + 0xc);
        lVar13 = lroundf(ppVar2->opacity * (float)ppVar21[1].type * 256.0);
        local_203c = (int)lVar13;
        plutovg_matrix_multiply
                  ((plutovg_matrix_t *)local_2068,(plutovg_matrix_t *)local_2068,&ppVar2->matrix);
        _Var7 = plutovg_matrix_invert((plutovg_matrix_t *)local_2068,(plutovg_matrix_t *)local_2068)
        ;
        uVar25 = local_2044;
        uVar23 = local_2048;
        if (_Var7) {
          if (((((float)local_2068._0_4_ == 1.0) && (!NAN((float)local_2068._0_4_))) &&
              ((float)local_2068._4_4_ == 0.0)) && (!NAN((float)local_2068._4_4_))) {
            if (((float)local_2068._8_4_ == 0.0) && (!NAN((float)local_2068._8_4_))) {
              if ((fStack_205c == 1.0) && (!NAN(fStack_205c))) {
                p_Var4 = composition_table[ppVar2->op];
                iVar32 = (int)(float)local_2058.ref_count;
                if (ppVar21[1].ref_count == 0) {
                  iVar8 = (span_buffer->spans).size;
                  if (iVar8 == 0) {
                    return;
                  }
                  iVar17 = (int)(float)local_2058.type;
                  ppVar5 = canvas->surface;
                  ppVar14 = (span_buffer->spans).data;
                  do {
                    lVar13 = (long)ppVar14->y + (long)iVar17;
                    iVar31 = (int)lVar13;
                    if ((-1 < iVar31) && (iVar31 < (int)uVar25)) {
                      uVar15 = ppVar14->x + iVar32;
                      if ((int)uVar15 < (int)uVar23) {
                        uVar26 = 0;
                        if (0 < (int)uVar15) {
                          uVar26 = (ulong)uVar15;
                        }
                        uVar22 = 0;
                        if ((int)uVar15 < 0) {
                          uVar22 = uVar15;
                        }
                        iVar18 = uVar22 + ppVar14->len;
                        iVar31 = uVar23 - (int)uVar26;
                        if (iVar18 + (int)uVar26 <= (int)uVar23) {
                          iVar31 = iVar18;
                        }
                        if (0 < iVar31) {
                          iVar18 = ppVar14->x;
                          if ((int)uVar15 < 0) {
                            iVar18 = -iVar32;
                          }
                          (*p_Var4)((uint32_t *)
                                    (ppVar5->data +
                                    (long)iVar18 * 4 + (long)ppVar5->stride * (long)ppVar14->y),
                                    iVar31,(uint32_t *)
                                           (local_2040 * lVar13 + local_2050 + uVar26 * 4),
                                    (int)((uint)ppVar14->coverage * local_203c) >> 8);
                        }
                      }
                    }
                    iVar8 = iVar8 + -1;
                    ppVar14 = ppVar14 + 1;
                  } while (iVar8 != 0);
                  return;
                }
                iVar32 = iVar32 % (int)local_2048;
                iVar17 = (int)(float)local_2058.type % (int)local_2044;
                iVar8 = (span_buffer->spans).size;
                if (iVar8 == 0) {
                  return;
                }
                uVar22 = iVar32 >> 0x1f & local_2048;
                uVar15 = iVar17 >> 0x1f & local_2044;
                ppVar5 = canvas->surface;
                local_2138 = (span_buffer->spans).data;
                do {
                  iVar31 = local_2138->len;
                  iVar18 = (int)(local_2138->y + uVar15 + iVar17) % (int)uVar25;
                  if (iVar31 != 0) {
                    iVar19 = (uint)local_2138->coverage * local_203c;
                    iVar28 = local_2138->x;
                    iVar20 = (int)(uVar22 + iVar32 + iVar28) % (int)uVar23;
                    iVar20 = (iVar20 >> 0x1f & uVar23) + iVar20;
                    do {
                      iVar16 = uVar23 - iVar20;
                      if (iVar31 <= (int)(uVar23 - iVar20)) {
                        iVar16 = iVar31;
                      }
                      if (0x3ff < iVar16) {
                        iVar16 = 0x400;
                      }
                      (*p_Var4)((uint32_t *)
                                (ppVar5->data +
                                (long)iVar28 * 4 + (long)ppVar5->stride * (long)local_2138->y),
                                iVar16,(uint32_t *)
                                       ((long)local_2040 *
                                        (long)(int)((iVar18 >> 0x1f & uVar25) + iVar18) + local_2050
                                       + (long)iVar20 * 4),iVar19 >> 8);
                      iVar28 = iVar28 + iVar16;
                      iVar20 = iVar20 + iVar16;
                      if ((int)uVar23 <= iVar20) {
                        iVar20 = 0;
                      }
                      iVar31 = iVar31 - iVar16;
                    } while (iVar31 != 0);
                  }
                  iVar8 = iVar8 + -1;
                  local_2138 = local_2138 + 1;
                } while (iVar8 != 0);
                return;
              }
            }
          }
          ppVar5 = canvas->surface;
          p_Var4 = composition_table[ppVar2->op];
          if (ppVar21[1].ref_count == 0) {
            iVar32 = (span_buffer->spans).size;
            if (iVar32 != 0) {
              fVar37 = (float)local_2068._0_4_ * 65536.0;
              fVar33 = (float)local_2068._4_4_ * 65536.0;
              ppVar14 = (span_buffer->spans).data;
              do {
                iVar8 = ppVar14->len;
                if (iVar8 != 0) {
                  iVar17 = (uint)ppVar14->coverage * local_203c;
                  fVar34 = (float)ppVar14->y + 0.5;
                  fVar38 = (float)ppVar14->x + 0.5;
                  iVar31 = (int)((fStack_205c * fVar34 + (float)local_2068._4_4_ * fVar38 +
                                 (float)local_2058.type) * 65536.0);
                  iVar18 = (int)((fVar34 * (float)local_2068._8_4_ +
                                  fVar38 * (float)local_2068._0_4_ + (float)local_2058.ref_count) *
                                65536.0);
                  puVar24 = (uint32_t *)
                            (ppVar5->data +
                            (long)ppVar14->x * 4 + (long)ppVar5->stride * (long)ppVar14->y);
                  do {
                    iVar28 = 0x400;
                    if (iVar8 < 0x400) {
                      iVar28 = iVar8;
                    }
                    if (0 < iVar8) {
                      ppVar21 = (plutovg_paint_t *)local_1068;
                      do {
                        uVar27 = 0;
                        uVar15 = iVar18 >> 0x10;
                        if ((((-1 < (int)uVar15) && ((int)uVar15 < (int)uVar23)) &&
                            (iVar19 = iVar31 >> 0x10, -1 < iVar19)) &&
                           (uVar27 = 0, iVar19 < (int)uVar25)) {
                          uVar27 = *(undefined4 *)
                                    ((long)iVar19 * (long)local_2040 + local_2050 +
                                    (ulong)uVar15 * 4);
                        }
                        ppVar21->ref_count = uVar27;
                        iVar18 = iVar18 + (int)fVar37;
                        iVar31 = iVar31 + (int)fVar33;
                        ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                      } while (ppVar21 < (undefined1 *)
                                         ((long)&((plutovg_paint_t *)local_1068)->ref_count +
                                         (long)iVar28 * 4));
                    }
                    (*p_Var4)(puVar24,iVar28,(uint32_t *)local_1068,iVar17 >> 8);
                    puVar24 = puVar24 + iVar28;
                    iVar8 = iVar8 - iVar28;
                  } while (iVar8 != 0);
                }
                iVar32 = iVar32 + -1;
                ppVar14 = ppVar14 + 1;
              } while (iVar32 != 0);
            }
          }
          else {
            iVar32 = local_2040 + 3;
            if (-1 < local_2040) {
              iVar32 = local_2040;
            }
            iVar8 = (span_buffer->spans).size;
            if (iVar8 != 0) {
              fVar37 = (float)local_2068._0_4_ * 65536.0;
              fVar33 = (float)local_2068._4_4_ * 65536.0;
              ppVar14 = (span_buffer->spans).data;
              do {
                lVar13 = local_2050;
                iVar17 = ppVar14->len;
                if (iVar17 != 0) {
                  iVar31 = (uint)ppVar14->coverage * local_203c;
                  fVar34 = (float)ppVar14->y + 0.5;
                  fVar38 = (float)ppVar14->x + 0.5;
                  iVar28 = (int)((fStack_205c * fVar34 + (float)local_2068._4_4_ * fVar38 +
                                 (float)local_2058.type) * 65536.0);
                  iVar18 = (int)((fVar34 * (float)local_2068._8_4_ +
                                  fVar38 * (float)local_2068._0_4_ + (float)local_2058.ref_count) *
                                65536.0);
                  puVar24 = (uint32_t *)
                            (ppVar5->data +
                            (long)ppVar14->x * 4 + (long)ppVar5->stride * (long)ppVar14->y);
                  do {
                    iVar19 = 0x400;
                    if (iVar17 < 0x400) {
                      iVar19 = iVar17;
                    }
                    if (0 < iVar17) {
                      ppVar21 = (plutovg_paint_t *)local_1068;
                      do {
                        iVar20 = (int)(CONCAT44(iVar18 >> 0x1f,iVar18 >> 0x10) % (long)(int)uVar23);
                        iVar20 = (iVar20 >> 0x1f & uVar23) + iVar20;
                        if ((iVar20 < 0) || ((int)uVar23 <= iVar20)) {
                          __assert_fail("px >= 0 && px < image_width",
                                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-blend.c"
                                        ,0x37e,
                                        "void blend_transformed_tiled_argb(plutovg_surface_t *, plutovg_operator_t, const texture_data_t *, const plutovg_span_buffer_t *)"
                                       );
                        }
                        iVar16 = (int)(CONCAT44(iVar28 >> 0x1f,iVar28 >> 0x10) % (long)(int)uVar25);
                        iVar16 = (iVar16 >> 0x1f & uVar25) + iVar16;
                        if ((iVar16 < 0) || ((int)uVar25 <= iVar16)) {
                          __assert_fail("py >= 0 && py < image_height",
                                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-blend.c"
                                        ,0x37f,
                                        "void blend_transformed_tiled_argb(plutovg_surface_t *, plutovg_operator_t, const texture_data_t *, const plutovg_span_buffer_t *)"
                                       );
                        }
                        ppVar21->ref_count =
                             *(undefined4 *)(lVar13 + (long)(iVar16 * (iVar32 >> 2) + iVar20) * 4);
                        iVar18 = iVar18 + (int)fVar37;
                        iVar28 = iVar28 + (int)fVar33;
                        ppVar21 = (plutovg_paint_t *)&ppVar21->type;
                      } while (ppVar21 < (undefined4 *)
                                         ((long)&((plutovg_paint_t *)local_1068)->ref_count +
                                         (long)iVar19 * 4));
                    }
                    (*p_Var4)(puVar24,iVar19,(uint32_t *)local_1068,iVar31 >> 8);
                    puVar24 = puVar24 + iVar19;
                    iVar17 = iVar17 - iVar19;
                  } while (iVar17 != 0);
                }
                iVar8 = iVar8 + -1;
                ppVar14 = ppVar14 + 1;
              } while (iVar8 != 0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void plutovg_blend(plutovg_canvas_t* canvas, const plutovg_span_buffer_t* span_buffer)
{
    if(span_buffer->spans.size == 0)
        return;
    if(canvas->state->paint == NULL) {
        plutovg_blend_color(canvas, &canvas->state->color, span_buffer);
        return;
    }

    plutovg_paint_t* paint = canvas->state->paint;
    if(paint->type == PLUTOVG_PAINT_TYPE_COLOR) {
        plutovg_solid_paint_t* solid = (plutovg_solid_paint_t*)(paint);
        plutovg_blend_color(canvas, &solid->color, span_buffer);
    } else if(paint->type == PLUTOVG_PAINT_TYPE_GRADIENT) {
        plutovg_gradient_paint_t* gradient = (plutovg_gradient_paint_t*)(paint);
        plutovg_blend_gradient(canvas, gradient, span_buffer);
    } else {
        plutovg_texture_paint_t* texture = (plutovg_texture_paint_t*)(paint);
        plutovg_blend_texture(canvas, texture, span_buffer);
    }
}